

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mid2mtb.cpp
# Opt level: O0

void printEvent(vector<double,_std::allocator<double>_> *event)

{
  size_type sVar1;
  reference pvVar2;
  int local_14;
  int i;
  vector<double,_std::allocator<double>_> *event_local;
  
  local_14 = 0;
  while( true ) {
    sVar1 = std::vector<double,_std::allocator<double>_>::size(event);
    if ((int)sVar1 <= local_14) break;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](event,(long)local_14);
    std::ostream::operator<<(&std::cout,*pvVar2);
    sVar1 = std::vector<double,_std::allocator<double>_>::size(event);
    if (local_14 < (int)sVar1 + -1) {
      std::operator<<((ostream *)&std::cout,"\t");
    }
    local_14 = local_14 + 1;
  }
  std::operator<<((ostream *)&std::cout,"\n");
  return;
}

Assistant:

void printEvent(vector<double>& event) {
	for (int i=0; i<(int)event.size(); i++) {
		cout << event[i];
		if (i<(int)event.size()-1) {
			cout << "\t";
		}
	}
	cout << "\n";
}